

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O2

void helper_gvec_sssub32_mips(void *d,void *a,void *b,uint32_t desc)

{
  uint uVar1;
  ulong oprsz;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  oprsz = (ulong)((desc & 0x1f) * 8 + 8);
  for (uVar2 = 0; uVar2 < oprsz; uVar2 = uVar2 + 4) {
    uVar1 = *(uint *)((long)a + uVar2);
    uVar4 = uVar1 - *(uint *)((long)b + uVar2);
    uVar3 = ((int)uVar4 >> 0x1f) + 0x80000000;
    if (-1 < (int)((uVar4 ^ uVar1) & (*(uint *)((long)b + uVar2) ^ uVar1))) {
      uVar3 = uVar4;
    }
    *(uint *)((long)d + uVar2) = uVar3;
  }
  clear_high(d,oprsz,desc);
  return;
}

Assistant:

void HELPER(gvec_add8)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint8_t)) {
        *(uint8_t *)((char *)d + i) = *(uint8_t *)((char *)a + i) + *(uint8_t *)((char *)b + i);
    }
    clear_high(d, oprsz, desc);
}